

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O3

void __thiscall
dd::TaskQueueStdlib::PostTask
          (TaskQueueStdlib *this,
          unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *task)

{
  pair<unsigned_long,_std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>_>
  local_28;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->_pending_lock);
  local_28.first = this->_thread_posting_order;
  this->_thread_posting_order = local_28.first + 1;
  local_28.second._M_t.super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>.
  _M_t.super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
  super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl =
       (__uniq_ptr_data<dd::QueuedTask,_std::default_delete<dd::QueuedTask>,_true,_true>)
       (task->_M_t).super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t
       .super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
       super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl;
  (task->_M_t).super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
  super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
  super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl = (QueuedTask *)0x0;
  std::
  deque<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::allocator<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>>
  ::
  emplace_back<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>
            ((deque<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>,std::allocator<std::pair<unsigned_long,std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>>>>
              *)&this->_pending_queue,&local_28);
  if (local_28.second._M_t.
      super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
      super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
      super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>)0x0) {
    (*(*(_func_int ***)
        local_28.second._M_t.
        super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>._M_t.
        super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
        super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl)[1])();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_pending_lock);
  Event::Set(&this->_flag_notify);
  return;
}

Assistant:

void TaskQueueStdlib::PostTask(std::unique_ptr<QueuedTask> task)
	{
		{
			AutoLock lock(_pending_lock);
			OrderId order = _thread_posting_order++;
			_pending_queue.push(std::pair<OrderId, std::unique_ptr<QueuedTask>>(order, std::move(task)));
		}
		NotifyWake();
	}